

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_accept(quicly_conn_t **conn,quicly_context_t *ctx,sockaddr *dest_addr,sockaddr *src_addr,
                 quicly_decoded_packet_t *packet,quicly_address_token_plaintext_t *address_token,
                 quicly_cid_plaintext_t *new_cid,ptls_handshake_properties_t *handshake_properties)

{
  anon_struct_4_2_d91fd178_for_address_validation *paVar1;
  anon_struct_464_5_de580c36_for_stats *paVar2;
  anon_struct_16_2_d6821df0_for_num_bytes *paVar3;
  uint32_t protocol_version;
  size_t __n;
  st_quicly_handshake_space_t *psVar4;
  st_quicly_conn_t *arg0;
  int64_t arg1;
  undefined8 uVar5;
  ptls_iovec_t salt;
  uint8_t arg5;
  int err;
  int iVar6;
  uint32_t initcwnd;
  ptls_cipher_suite_t *cs;
  quicly_conn_t *pqVar7;
  undefined1 *puVar8;
  uint8_t *puVar9;
  uint64_t offending_frame_type;
  anon_struct_40_3_1d7380ec cipher;
  uint64_t pn;
  uint64_t next_expected_pn;
  int is_ack_only;
  ptls_iovec_t payload;
  uint64_t local_b0;
  st_quicly_cipher_context_t local_a8;
  st_quicly_cipher_context_t local_98;
  int local_88;
  undefined4 uStack_84;
  ptls_iovec_t *local_78;
  quicly_address_token_plaintext_t *local_70;
  uint64_t local_68;
  uint64_t local_60;
  int local_54;
  uint8_t *local_50;
  undefined8 uStack_48;
  ptls_iovec_t local_40;
  
  local_98.aead = (ptls_aead_context_t *)0x0;
  local_98.header_protection = (ptls_cipher_context_t *)0x0;
  local_88 = 0;
  uStack_84 = 0;
  local_a8.aead = (ptls_aead_context_t *)0x0;
  local_a8.header_protection = (ptls_cipher_context_t *)0x0;
  local_b0 = 0;
  *conn = (quicly_conn_t *)0x0;
  err = 0xff01;
  if ((*(packet->octets).base & 0xf0) == 0xc0) {
    puVar8 = (uint8_t *)0x0;
    if (packet->version == 0xff00001b) {
      puVar8 = get_salt_draft27;
    }
    puVar9 = get_salt_current;
    if (packet->version != 0xff00001d) {
      puVar9 = puVar8;
    }
    err = 0xff01;
    if (((puVar9 != (uint8_t *)0x0) && (0x4af < packet->datagram_size)) &&
       (err = 0x2000a, 7 < (packet->cid).dest.encrypted.len)) {
      local_70 = address_token;
      cs = get_aes128gcmsha256(ctx);
      uStack_48 = 0x14;
      salt.len = 0x14;
      salt.base = puVar9;
      local_50 = puVar9;
      err = setup_initial_encryption
                      (cs,&local_a8,&local_98,(packet->cid).dest.encrypted,0,salt,
                       (quicly_conn_t *)0x0);
      if (err == 0) {
        local_60 = 0;
        local_88 = 1;
        iVar6 = decrypt_packet(local_a8.header_protection,aead_decrypt_fixed_key,local_a8.aead,
                               &local_60,packet,&local_68,&local_40);
        err = 0xff09;
        if (iVar6 == 0) {
          protocol_version = packet->version;
          local_78 = &(packet->cid).src;
          initcwnd = quicly_cc_calc_initial_cwnd
                               (ctx->initcwnd_packets,
                                (uint16_t)(ctx->transport_params).max_udp_payload_size);
          pqVar7 = create_connection(ctx,protocol_version,(char *)0x0,src_addr,dest_addr,local_78,
                                     new_cid,handshake_properties,initcwnd);
          *conn = pqVar7;
          if (pqVar7 == (quicly_conn_t *)0x0) {
            err = 0x201;
            goto LAB_0011a4a3;
          }
          (pqVar7->super).state = QUICLY_STATE_ACCEPTING;
          __n = (packet->cid).dest.encrypted.len;
          memcpy(&(pqVar7->super).original_dcid,(packet->cid).dest.encrypted.base,__n);
          (pqVar7->super).original_dcid.len = (uint8_t)__n;
          if ((local_70 != (quicly_address_token_plaintext_t *)0x0) &&
             (paVar1 = &((*conn)->super).remote.address_validation,
             *(byte *)paVar1 = *(byte *)paVar1 | 1,
             local_70->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY)) {
            pqVar7 = *conn;
            *(undefined8 *)((pqVar7->retry_scid).cid + 0xd) =
                 *(undefined8 *)((pqVar7->super).original_dcid.cid + 0xd);
            uVar5 = *(undefined8 *)((pqVar7->super).original_dcid.cid + 8);
            *(undefined8 *)(pqVar7->retry_scid).cid =
                 *(undefined8 *)(pqVar7->super).original_dcid.cid;
            *(undefined8 *)((pqVar7->retry_scid).cid + 8) = uVar5;
            pqVar7 = *conn;
            *(undefined8 *)((pqVar7->super).original_dcid.cid + 0xd) =
                 *(undefined8 *)((long)&local_70->field_4 + 0xd);
            uVar5 = *(undefined8 *)((long)&local_70->field_4 + 8);
            *(undefined8 *)(pqVar7->super).original_dcid.cid = *(undefined8 *)&local_70->field_4;
            *(undefined8 *)((pqVar7->super).original_dcid.cid + 8) = uVar5;
          }
          err = setup_handshake_space_and_flow(*conn,0);
          if (err == 0) {
            psVar4 = (*conn)->initial;
            (psVar4->super).next_expected_packet_number = local_60;
            (psVar4->cipher).ingress.aead = local_a8.aead;
            (psVar4->cipher).ingress.header_protection = local_a8.header_protection;
            psVar4 = (*conn)->initial;
            (psVar4->cipher).egress.aead = local_98.aead;
            (psVar4->cipher).egress.header_protection = local_98.header_protection;
            local_88 = 0;
            ((*conn)->crypto).handshake_properties.collected_extensions =
                 server_collected_extensions;
            arg0 = *conn;
            arg0->initial->largest_ingress_udp_payload_size = (uint16_t)packet->datagram_size;
            arg1 = (arg0->stash).now;
            arg5 = get_epoch(*(packet->octets).base);
            QUICLY_TRACER_PACKET_RECEIVED(arg0,arg1,local_68,local_40.base,local_40.len,arg5);
            pqVar7 = *conn;
            paVar2 = &(pqVar7->super).stats;
            (paVar2->num_packets).received = (paVar2->num_packets).received + 1;
            paVar3 = &(pqVar7->super).stats.num_bytes;
            paVar3->received = paVar3->received + packet->datagram_size;
            err = handle_payload(pqVar7,0,local_40.base,local_40.len,&local_b0,&local_54);
            if (err == 0) {
              pqVar7 = *conn;
              err = record_receipt(&pqVar7->initial->super,local_68,0,(pqVar7->stash).now,
                                   &(pqVar7->egress).send_ack_at);
            }
          }
        }
      }
    }
    pqVar7 = *conn;
    if (pqVar7 != (quicly_conn_t *)0x0) {
      if (err == 0) {
        (pqVar7->super).state = QUICLY_STATE_CONNECTED;
      }
      else {
        initiate_close(pqVar7,err,local_b0,"");
        pqVar7 = *conn;
      }
      unlock_now(pqVar7);
      err = 0;
    }
  }
LAB_0011a4a3:
  if (local_88 != 0) {
    dispose_cipher(&local_a8);
    dispose_cipher(&local_98);
  }
  return err;
}

Assistant:

int quicly_accept(quicly_conn_t **conn, quicly_context_t *ctx, struct sockaddr *dest_addr, struct sockaddr *src_addr,
                  quicly_decoded_packet_t *packet, quicly_address_token_plaintext_t *address_token,
                  const quicly_cid_plaintext_t *new_cid, ptls_handshake_properties_t *handshake_properties)
{
    const struct st_ptls_salt_t *salt;
    struct {
        struct st_quicly_cipher_context_t ingress, egress;
        int alive;
    } cipher = {};
    ptls_iovec_t payload;
    uint64_t next_expected_pn, pn, offending_frame_type = QUICLY_FRAME_TYPE_PADDING;
    int is_ack_only, ret;

    *conn = NULL;

    /* process initials only */
    if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) != QUICLY_PACKET_TYPE_INITIAL) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if ((salt = get_salt(packet->version)) == NULL) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if (packet->datagram_size < QUICLY_MIN_CLIENT_INITIAL_SIZE) {
        ret = QUICLY_ERROR_PACKET_IGNORED;
        goto Exit;
    }
    if (packet->cid.dest.encrypted.len < 8) {
        ret = QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;
        goto Exit;
    }
    if ((ret = setup_initial_encryption(get_aes128gcmsha256(ctx), &cipher.ingress, &cipher.egress, packet->cid.dest.encrypted, 0,
                                        ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL)) != 0)
        goto Exit;
    cipher.alive = 1;
    next_expected_pn = 0; /* is this correct? do we need to take care of underflow? */
    if ((ret = decrypt_packet(cipher.ingress.header_protection, aead_decrypt_fixed_key, cipher.ingress.aead, &next_expected_pn,
                              packet, &pn, &payload)) != 0) {
        ret = QUICLY_ERROR_DECRYPTION_FAILED;
        goto Exit;
    }

    /* create connection */
    if ((*conn = create_connection(
             ctx, packet->version, NULL, src_addr, dest_addr, &packet->cid.src, new_cid, handshake_properties,
             quicly_cc_calc_initial_cwnd(ctx->initcwnd_packets, ctx->transport_params.max_udp_payload_size))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    (*conn)->super.state = QUICLY_STATE_ACCEPTING;
    quicly_set_cid(&(*conn)->super.original_dcid, packet->cid.dest.encrypted);
    if (address_token != NULL) {
        (*conn)->super.remote.address_validation.validated = 1;
        if (address_token->type == QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
            (*conn)->retry_scid = (*conn)->super.original_dcid;
            (*conn)->super.original_dcid = address_token->retry.original_dcid;
        }
    }
    if ((ret = setup_handshake_space_and_flow(*conn, QUICLY_EPOCH_INITIAL)) != 0)
        goto Exit;
    (*conn)->initial->super.next_expected_packet_number = next_expected_pn;
    (*conn)->initial->cipher.ingress = cipher.ingress;
    (*conn)->initial->cipher.egress = cipher.egress;
    cipher.alive = 0;
    (*conn)->crypto.handshake_properties.collected_extensions = server_collected_extensions;
    (*conn)->initial->largest_ingress_udp_payload_size = packet->datagram_size;

    QUICLY_PROBE(ACCEPT, *conn, (*conn)->stash.now,
                 QUICLY_PROBE_HEXDUMP(packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len), address_token);
    QUICLY_PROBE(PACKET_RECEIVED, *conn, (*conn)->stash.now, pn, payload.base, payload.len, get_epoch(packet->octets.base[0]));

    /* handle the input; we ignore is_ack_only, we consult if there's any output from TLS in response to CH anyways */
    (*conn)->super.stats.num_packets.received += 1;
    (*conn)->super.stats.num_bytes.received += packet->datagram_size;
    if ((ret = handle_payload(*conn, QUICLY_EPOCH_INITIAL, payload.base, payload.len, &offending_frame_type, &is_ack_only)) != 0)
        goto Exit;
    if ((ret = record_receipt(&(*conn)->initial->super, pn, 0, (*conn)->stash.now, &(*conn)->egress.send_ack_at)) != 0)
        goto Exit;

Exit:
    if (*conn != NULL) {
        if (ret == 0) {
            (*conn)->super.state = QUICLY_STATE_CONNECTED;
        } else {
            initiate_close(*conn, ret, offending_frame_type, "");
            ret = 0;
        }
        unlock_now(*conn);
    }
    if (cipher.alive) {
        dispose_cipher(&cipher.ingress);
        dispose_cipher(&cipher.egress);
    }
    return ret;
}